

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.cc
# Opt level: O1

void CAST_ecb_encrypt(uchar *in,uchar *out,CAST_KEY *key,int enc)

{
  uint32_t d [2];
  uint local_10;
  uint local_c;
  
  local_10 = (uint)in[3] | (uint)in[2] << 8 | (uint)in[1] << 0x10 | (uint)*in << 0x18;
  local_c = (uint)in[7] | (uint)in[6] << 8 | (uint)in[5] << 0x10 | (uint)in[4] << 0x18;
  if (enc == 0) {
    CAST_decrypt(&local_10,key);
  }
  else {
    CAST_encrypt(&local_10,key);
  }
  *(uint *)out = local_10 >> 0x18 | (local_10 & 0xff0000) >> 8 | (local_10 & 0xff00) << 8 |
                 local_10 << 0x18;
  *(uint *)(out + 4) =
       local_c >> 0x18 | (local_c & 0xff0000) >> 8 | (local_c & 0xff00) << 8 | local_c << 0x18;
  return;
}

Assistant:

void CAST_ecb_encrypt(const uint8_t *in, uint8_t *out, const CAST_KEY *ks,
                      int enc) {
  uint32_t d[2];

  n2l(in, d[0]);
  n2l(in, d[1]);
  if (enc) {
    CAST_encrypt(d, ks);
  } else {
    CAST_decrypt(d, ks);
  }
  l2n(d[0], out);
  l2n(d[1], out);
}